

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O3

void __thiscall OpenMD::MoleculeStamp::checkAtoms(MoleculeStamp *this)

{
  pointer pcVar1;
  __normal_iterator<OpenMD::AtomStamp_**,_std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>_>
  _Var2;
  ostream *poVar3;
  OpenMDException *this_00;
  ostringstream oss;
  string local_1c0;
  undefined8 local_1a0 [47];
  
  local_1a0[0] = 0;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::AtomStamp**,std::vector<OpenMD::AtomStamp*,std::allocator<OpenMD::AtomStamp*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::AtomStamp*const>>
                    ((this->atomStamps_).
                     super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->atomStamps_).
                     super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  if (_Var2._M_current ==
      (this->atomStamps_).
      super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Error in Molecule ",0x12)
  ;
  pcVar1 = (this->Name).data_._M_dataplus._M_p;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar1,pcVar1 + (this->Name).data_._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": atom[",7);
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] is missing\n",0xd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(this_00,&local_1c0);
  __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void MoleculeStamp::checkAtoms() {
    std::vector<AtomStamp*>::iterator ai = std::find(
        atomStamps_.begin(), atomStamps_.end(), static_cast<AtomStamp*>(NULL));
    if (ai != atomStamps_.end()) {
      std::ostringstream oss;
      oss << "Error in Molecule " << getName() << ": atom["
          << ai - atomStamps_.begin() << "] is missing\n";
      throw OpenMDException(oss.str());
    }
  }